

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cod_node.c
# Opt level: O0

void cod_print(sm_ref node)

{
  undefined4 *in_RDI;
  dimen_p_conflict in_stack_ffffffffffffff80;
  operator_t oVar2;
  char *pcVar1;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  switch(*in_RDI) {
  case 0:
    printf("0x%p  --  compound_statement ->\n",in_RDI);
    printf("\tdecls : ");
    cod_print_sm_list((sm_list)0x161d02);
    printf("\n");
    printf("\tstatements : ");
    cod_print_sm_list((sm_list)0x161d2f);
    printf("\n");
    break;
  case 1:
    printf("0x%p  --  enumerator ->\n",in_RDI);
    if (*(long *)(in_RDI + 2) == 0) {
      local_18 = "<NULL>";
    }
    else {
      local_18 = *(char **)(in_RDI + 2);
    }
    printf("\tid : %s\n",local_18);
    printf("\tconst_expression : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tenum_value : %d\n",(ulong)(uint)in_RDI[6]);
    break;
  case 2:
    printf("0x%p  --  declaration ->\n",in_RDI);
    printf("\ttype_spec : ");
    cod_print_sm_list((sm_list)0x161e06);
    printf("\n");
    printf("\tsm_complex_type : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tfreeable_complex_type : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tstatic_var : %d\n",(ulong)(uint)in_RDI[8]);
    printf("\tconst_var : %d\n",(ulong)(uint)in_RDI[9]);
    printf("\tparam_num : %d\n",(ulong)(uint)in_RDI[10]);
    if (*(long *)(in_RDI + 0xc) == 0) {
      local_20 = "<NULL>";
    }
    else {
      local_20 = *(char **)(in_RDI + 0xc);
    }
    printf("\tid : %s\n",local_20);
    printf("\tinit_value : %p\n",*(undefined8 *)(in_RDI + 0xe));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x161f0d);
    printf("\n");
    printf("\tis_subroutine : %d\n",(ulong)(uint)in_RDI[0x12]);
    printf("\tvaridiac_subroutine_param_count : %d\n",(ulong)(uint)in_RDI[0x13]);
    printf("\tis_typedef : %d\n",(ulong)(uint)in_RDI[0x14]);
    printf("\taddr_taken : %d\n",(ulong)(uint)in_RDI[0x15]);
    printf("\tis_extern : %d\n",(ulong)(uint)in_RDI[0x16]);
    printf("\tparams : ");
    cod_print_sm_list((sm_list)0x161fb7);
    printf("\n");
    printf("\tcg_oprnd : %d\n",(ulong)(uint)in_RDI[0x1a]);
    printf("\tcg_type : %d\n",(ulong)(uint)in_RDI[0x1b]);
    printf("\tclosure_id : %p\n",*(undefined8 *)(in_RDI + 0x1c));
    printf("\tcg_address : %p\n",*(undefined8 *)(in_RDI + 0x1e));
    break;
  case 3:
    printf("0x%p  --  label_statement ->\n",in_RDI);
    if (*(long *)(in_RDI + 2) == 0) {
      local_28 = "<NULL>";
    }
    else {
      local_28 = *(char **)(in_RDI + 2);
    }
    printf("\tname : %s\n",local_28);
    printf("\tcg_label : %d\n",(ulong)(uint)in_RDI[4]);
    printf("\tstatement : %p\n",*(undefined8 *)(in_RDI + 6));
    break;
  case 4:
    printf("0x%p  --  return_statement ->\n",in_RDI);
    printf("\texpression : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\tcg_func_type : %d\n",(ulong)(uint)in_RDI[4]);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162127);
    printf("\n");
    break;
  case 5:
    printf("0x%p  --  jump_statement ->\n",in_RDI);
    printf("\tcontinue_flag : %d\n",(ulong)(uint)in_RDI[2]);
    if (*(long *)(in_RDI + 4) == 0) {
      local_30 = "<NULL>";
    }
    else {
      local_30 = *(char **)(in_RDI + 4);
    }
    printf("\tgoto_target : %s\n",local_30);
    printf("\tsm_target_stmt : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1621e3);
    printf("\n");
    break;
  case 6:
    printf("0x%p  --  selection_statement ->\n",in_RDI);
    printf("\tconditional : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\tthen_part : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\telse_part : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162279);
    printf("\n");
    break;
  case 7:
    printf("0x%p  --  iteration_statement ->\n",in_RDI);
    printf("\tinit_expr : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\ttest_expr : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tpost_test_expr : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\titer_expr : %p\n",*(undefined8 *)(in_RDI + 8));
    printf("\tstatement : %p\n",*(undefined8 *)(in_RDI + 10));
    printf("\tcg_iter_label : %d\n",(ulong)(uint)in_RDI[0xc]);
    printf("\tcg_end_label : %d\n",(ulong)(uint)in_RDI[0xd]);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162375);
    printf("\n");
    break;
  case 8:
    printf("0x%p  --  expression_statement ->\n",in_RDI);
    printf("\texpression : %p\n",*(undefined8 *)(in_RDI + 2));
    break;
  case 9:
    printf("0x%p  --  assignment_expression ->\n",in_RDI);
    oVar2 = (operator_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    printf("\tleft : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\tright : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162426);
    printf("\n");
    printf("\top : ");
    cod_print_operator_t(oVar2);
    printf("\n");
    printf("\tcg_type : %d\n",(ulong)(uint)in_RDI[9]);
    break;
  case 10:
    printf("0x%p  --  comma_expression ->\n",in_RDI);
    printf("\tleft : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\tright : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1624e7);
    printf("\n");
    break;
  case 0xb:
    printf("0x%p  --  operator ->\n",in_RDI);
    oVar2 = (operator_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    printf("\top : ");
    cod_print_operator_t(oVar2);
    printf("\n");
    printf("\tleft : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tright : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x16258f);
    printf("\n");
    printf("\toperation_type : %d\n",(ulong)(uint)in_RDI[10]);
    printf("\tresult_type : %d\n",(ulong)(uint)in_RDI[0xb]);
    break;
  case 0xc:
    printf("0x%p  --  conditional_operator ->\n",in_RDI);
    printf("\tcondition : %p\n",*(undefined8 *)(in_RDI + 2));
    printf("\te1 : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\te2 : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162657);
    printf("\n");
    printf("\tresult_type : %d\n",(ulong)(uint)in_RDI[10]);
    break;
  case 0xd:
    printf("0x%p  --  identifier ->\n",in_RDI);
    if (*(long *)(in_RDI + 2) == 0) {
      local_38 = "<NULL>";
    }
    else {
      local_38 = *(char **)(in_RDI + 2);
    }
    printf("\tid : %s\n",local_38);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1626f9);
    printf("\n");
    printf("\tsm_declaration : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tcg_type : %d\n",(ulong)(uint)in_RDI[8]);
    break;
  case 0xe:
    printf("0x%p  --  constant ->\n",in_RDI);
    printf("\ttoken : %d\n",(ulong)(uint)in_RDI[2]);
    if (*(long *)(in_RDI + 4) == 0) {
      local_40 = "<NULL>";
    }
    else {
      local_40 = *(char **)(in_RDI + 4);
    }
    printf("\tconst_val : %s\n",local_40);
    if (*(long *)(in_RDI + 6) == 0) {
      local_48 = "<NULL>";
    }
    else {
      local_48 = *(char **)(in_RDI + 6);
    }
    printf("\tfreeable_name : %s\n",local_48);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x16280f);
    printf("\n");
    break;
  case 0xf:
    printf("0x%p  --  type_specifier ->\n",in_RDI);
    printf("\ttoken : %d\n",(ulong)(uint)in_RDI[2]);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162870);
    printf("\n");
    printf("\tcreated_type_decl : %p\n",*(undefined8 *)(in_RDI + 6));
    break;
  case 0x10:
    printf("0x%p  --  struct_type_decl ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1628d2);
    printf("\n");
    if (*(long *)(in_RDI + 4) == 0) {
      local_50 = "<NULL>";
    }
    else {
      local_50 = *(char **)(in_RDI + 4);
    }
    printf("\tid : %s\n",local_50);
    printf("\tfields : ");
    cod_print_sm_list((sm_list)0x162940);
    printf("\n");
    printf("\tcg_size : %d\n",(ulong)(uint)in_RDI[8]);
    printf("\tencode_info : ");
    cod_print_enc_info((enc_info)in_stack_ffffffffffffff80);
    printf("\n");
    break;
  case 0x11:
    printf("0x%p  --  enum_type_decl ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1629ce);
    printf("\n");
    if (*(long *)(in_RDI + 4) == 0) {
      local_58 = "<NULL>";
    }
    else {
      local_58 = *(char **)(in_RDI + 4);
    }
    printf("\tid : %s\n",local_58);
    printf("\tenums : ");
    cod_print_sm_list((sm_list)0x162a3c);
    printf("\n");
    break;
  case 0x12:
    printf("0x%p  --  array_type_decl ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162a84);
    printf("\n");
    printf("\tsize_expr : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\telement_ref : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tstatic_var : %d\n",(ulong)(uint)in_RDI[8]);
    printf("\ttype_spec : ");
    cod_print_sm_list((sm_list)0x162afe);
    printf("\n");
    printf("\tdimensions : ");
    cod_print_dimen_p(in_stack_ffffffffffffff80);
    printf("\n");
    printf("\tcg_static_size : %d\n",(ulong)(uint)in_RDI[0xe]);
    printf("\tsm_dynamic_size : %p\n",*(undefined8 *)(in_RDI + 0x10));
    printf("\tcg_element_type : %d\n",(ulong)(uint)in_RDI[0x12]);
    printf("\tsm_complex_element_type : %p\n",*(undefined8 *)(in_RDI + 0x14));
    printf("\tfreeable_complex_element_type : %p\n",*(undefined8 *)(in_RDI + 0x16));
    printf("\tcg_element_size : %d\n",(ulong)(uint)in_RDI[0x18]);
    break;
  case 0x13:
    printf("0x%p  --  reference_type_decl ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162c0c);
    printf("\n");
    if (*(long *)(in_RDI + 4) == 0) {
      local_60 = "<NULL>";
    }
    else {
      local_60 = *(char **)(in_RDI + 4);
    }
    printf("\tname : %s\n",local_60);
    printf("\ttype_spec : ");
    cod_print_sm_list((sm_list)0x162c7a);
    printf("\n");
    printf("\tcg_referenced_type : %d\n",(ulong)(uint)in_RDI[8]);
    printf("\tsm_complex_referenced_type : %p\n",*(undefined8 *)(in_RDI + 10));
    printf("\tfreeable_complex_referenced_type : %p\n",*(undefined8 *)(in_RDI + 0xc));
    printf("\tcg_referenced_size : %d\n",(ulong)(uint)in_RDI[0xe]);
    printf("\tkernel_ref : %d\n",(ulong)(uint)in_RDI[0xf]);
    break;
  case 0x14:
    printf("0x%p  --  field ->\n",in_RDI);
    if (*(long *)(in_RDI + 2) == 0) {
      local_68 = "<NULL>";
    }
    else {
      local_68 = *(char **)(in_RDI + 2);
    }
    printf("\tname : %s\n",local_68);
    if (*(long *)(in_RDI + 4) == 0) {
      local_70 = "<NULL>";
    }
    else {
      local_70 = *(char **)(in_RDI + 4);
    }
    printf("\tstring_type : %s\n",local_70);
    printf("\ttype_spec : ");
    cod_print_sm_list((sm_list)0x162dc3);
    printf("\n");
    printf("\tsm_complex_type : %p\n",*(undefined8 *)(in_RDI + 8));
    printf("\tfreeable_complex_type : %p\n",*(undefined8 *)(in_RDI + 10));
    printf("\tcg_size : %d\n",(ulong)(uint)in_RDI[0xc]);
    printf("\tcg_offset : %d\n",(ulong)(uint)in_RDI[0xd]);
    printf("\tcg_type : %d\n",(ulong)(uint)in_RDI[0xe]);
    break;
  case 0x15:
    printf("0x%p  --  field_ref ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162e8a);
    printf("\n");
    printf("\tstruct_ref : %p\n",*(undefined8 *)(in_RDI + 4));
    if (*(long *)(in_RDI + 6) == 0) {
      local_78 = "<NULL>";
    }
    else {
      local_78 = *(char **)(in_RDI + 6);
    }
    printf("\tlx_field : %s\n",local_78);
    printf("\tsm_field_ref : %p\n",*(undefined8 *)(in_RDI + 8));
    break;
  case 0x16:
    printf("0x%p  --  subroutine_call ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162f47);
    printf("\n");
    printf("\tsm_func_ref : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\targuments : ");
    cod_print_sm_list((sm_list)0x162f8e);
    printf("\n");
    break;
  case 0x17:
    printf("0x%p  --  element_ref ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x162fd6);
    printf("\n");
    printf("\tarray_ref : %p\n",*(undefined8 *)(in_RDI + 4));
    printf("\tsm_complex_element_type : %p\n",*(undefined8 *)(in_RDI + 6));
    printf("\tsm_containing_structure_ref : %p\n",*(undefined8 *)(in_RDI + 8));
    printf("\tcg_element_type : %d\n",(ulong)(uint)in_RDI[10]);
    printf("\tthis_index_dimension : %d\n",(ulong)(uint)in_RDI[0xb]);
    printf("\texpression : %p\n",*(undefined8 *)(in_RDI + 0xc));
    break;
  case 0x18:
    printf("0x%p  --  cast ->\n",in_RDI);
    printf("\tlx_srcpos : ");
    cod_print_srcpos((srcpos)0x1630b8);
    printf("\n");
    printf("\ttype_spec : ");
    cod_print_sm_list((sm_list)0x1630e5);
    printf("\n");
    printf("\tcg_type : %d\n",(ulong)(uint)in_RDI[6]);
    printf("\texpression : %p\n",*(undefined8 *)(in_RDI + 8));
    printf("\tsm_complex_type : %p\n",*(undefined8 *)(in_RDI + 10));
    break;
  case 0x19:
    printf("0x%p  --  initializer_list ->\n",in_RDI);
    printf("\tinitializers : ");
    cod_print_sm_list((sm_list)0x16317a);
    printf("\n");
    break;
  case 0x1a:
    printf("0x%p  --  initializer ->\n",in_RDI);
    printf("\tdesignation : ");
    cod_print_sm_list((sm_list)0x1631c2);
    printf("\n");
    printf("\tinitializer : %p\n",*(undefined8 *)(in_RDI + 4));
    break;
  case 0x1b:
    printf("0x%p  --  designator ->\n",in_RDI);
    printf("\texpression : %p\n",*(undefined8 *)(in_RDI + 2));
    if (*(long *)(in_RDI + 4) == 0) {
      pcVar1 = "<NULL>";
    }
    else {
      pcVar1 = *(char **)(in_RDI + 4);
    }
    printf("\tid : %s\n",pcVar1);
    break;
  default:
    printf("Unhandled case in cod_print\n");
  }
  printf("\n");
  return;
}

Assistant:

extern void cod_print(sm_ref node)
{
    switch(node->node_type) {
      case cod_compound_statement: {
          printf("0x%p  --  compound_statement ->\n", node);
          printf("	decls : ");
          cod_print_sm_list(node->node.compound_statement.decls);
          printf("\n");
          printf("	statements : ");
          cod_print_sm_list(node->node.compound_statement.statements);
          printf("\n");
          break;
      }
      case cod_enumerator: {
          printf("0x%p  --  enumerator ->\n", node);
          printf("	id : %s\n", (node->node.enumerator.id == NULL) ? "<NULL>" : node->node.enumerator.id);
          printf("	const_expression : %p\n", node->node.enumerator.const_expression);
          printf("	enum_value : %d\n", node->node.enumerator.enum_value);
          break;
      }
      case cod_declaration: {
          printf("0x%p  --  declaration ->\n", node);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.declaration.type_spec);
          printf("\n");
          printf("	sm_complex_type : %p\n", node->node.declaration.sm_complex_type);
          printf("	freeable_complex_type : %p\n", node->node.declaration.freeable_complex_type);
          printf("	static_var : %d\n", node->node.declaration.static_var);
          printf("	const_var : %d\n", node->node.declaration.const_var);
          printf("	param_num : %d\n", node->node.declaration.param_num);
          printf("	id : %s\n", (node->node.declaration.id == NULL) ? "<NULL>" : node->node.declaration.id);
          printf("	init_value : %p\n", node->node.declaration.init_value);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.declaration.lx_srcpos);
          printf("\n");
          printf("	is_subroutine : %d\n", node->node.declaration.is_subroutine);
          printf("	varidiac_subroutine_param_count : %d\n", node->node.declaration.varidiac_subroutine_param_count);
          printf("	is_typedef : %d\n", node->node.declaration.is_typedef);
          printf("	addr_taken : %d\n", node->node.declaration.addr_taken);
          printf("	is_extern : %d\n", node->node.declaration.is_extern);
          printf("	params : ");
          cod_print_sm_list(node->node.declaration.params);
          printf("\n");
          printf("	cg_oprnd : %d\n", node->node.declaration.cg_oprnd);
          printf("	cg_type : %d\n", node->node.declaration.cg_type);
          printf("	closure_id : %p\n", node->node.declaration.closure_id);
          printf("	cg_address : %p\n", node->node.declaration.cg_address);
          break;
      }
      case cod_label_statement: {
          printf("0x%p  --  label_statement ->\n", node);
          printf("	name : %s\n", (node->node.label_statement.name == NULL) ? "<NULL>" : node->node.label_statement.name);
          printf("	cg_label : %d\n", node->node.label_statement.cg_label);
          printf("	statement : %p\n", node->node.label_statement.statement);
          break;
      }
      case cod_return_statement: {
          printf("0x%p  --  return_statement ->\n", node);
          printf("	expression : %p\n", node->node.return_statement.expression);
          printf("	cg_func_type : %d\n", node->node.return_statement.cg_func_type);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.return_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_jump_statement: {
          printf("0x%p  --  jump_statement ->\n", node);
          printf("	continue_flag : %d\n", node->node.jump_statement.continue_flag);
          printf("	goto_target : %s\n", (node->node.jump_statement.goto_target == NULL) ? "<NULL>" : node->node.jump_statement.goto_target);
          printf("	sm_target_stmt : %p\n", node->node.jump_statement.sm_target_stmt);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.jump_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_selection_statement: {
          printf("0x%p  --  selection_statement ->\n", node);
          printf("	conditional : %p\n", node->node.selection_statement.conditional);
          printf("	then_part : %p\n", node->node.selection_statement.then_part);
          printf("	else_part : %p\n", node->node.selection_statement.else_part);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.selection_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_iteration_statement: {
          printf("0x%p  --  iteration_statement ->\n", node);
          printf("	init_expr : %p\n", node->node.iteration_statement.init_expr);
          printf("	test_expr : %p\n", node->node.iteration_statement.test_expr);
          printf("	post_test_expr : %p\n", node->node.iteration_statement.post_test_expr);
          printf("	iter_expr : %p\n", node->node.iteration_statement.iter_expr);
          printf("	statement : %p\n", node->node.iteration_statement.statement);
          printf("	cg_iter_label : %d\n", node->node.iteration_statement.cg_iter_label);
          printf("	cg_end_label : %d\n", node->node.iteration_statement.cg_end_label);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.iteration_statement.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_expression_statement: {
          printf("0x%p  --  expression_statement ->\n", node);
          printf("	expression : %p\n", node->node.expression_statement.expression);
          break;
      }
      case cod_assignment_expression: {
          printf("0x%p  --  assignment_expression ->\n", node);
          printf("	left : %p\n", node->node.assignment_expression.left);
          printf("	right : %p\n", node->node.assignment_expression.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.assignment_expression.lx_srcpos);
          printf("\n");
          printf("	op : ");
          cod_print_operator_t(node->node.assignment_expression.op);
          printf("\n");
          printf("	cg_type : %d\n", node->node.assignment_expression.cg_type);
          break;
      }
      case cod_comma_expression: {
          printf("0x%p  --  comma_expression ->\n", node);
          printf("	left : %p\n", node->node.comma_expression.left);
          printf("	right : %p\n", node->node.comma_expression.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.comma_expression.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_operator: {
          printf("0x%p  --  operator ->\n", node);
          printf("	op : ");
          cod_print_operator_t(node->node.operator.op);
          printf("\n");
          printf("	left : %p\n", node->node.operator.left);
          printf("	right : %p\n", node->node.operator.right);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.operator.lx_srcpos);
          printf("\n");
          printf("	operation_type : %d\n", node->node.operator.operation_type);
          printf("	result_type : %d\n", node->node.operator.result_type);
          break;
      }
      case cod_conditional_operator: {
          printf("0x%p  --  conditional_operator ->\n", node);
          printf("	condition : %p\n", node->node.conditional_operator.condition);
          printf("	e1 : %p\n", node->node.conditional_operator.e1);
          printf("	e2 : %p\n", node->node.conditional_operator.e2);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.conditional_operator.lx_srcpos);
          printf("\n");
          printf("	result_type : %d\n", node->node.conditional_operator.result_type);
          break;
      }
      case cod_identifier: {
          printf("0x%p  --  identifier ->\n", node);
          printf("	id : %s\n", (node->node.identifier.id == NULL) ? "<NULL>" : node->node.identifier.id);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.identifier.lx_srcpos);
          printf("\n");
          printf("	sm_declaration : %p\n", node->node.identifier.sm_declaration);
          printf("	cg_type : %d\n", node->node.identifier.cg_type);
          break;
      }
      case cod_constant: {
          printf("0x%p  --  constant ->\n", node);
          printf("	token : %d\n", node->node.constant.token);
          printf("	const_val : %s\n", (node->node.constant.const_val == NULL) ? "<NULL>" : node->node.constant.const_val);
          printf("	freeable_name : %s\n", (node->node.constant.freeable_name == NULL) ? "<NULL>" : node->node.constant.freeable_name);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.constant.lx_srcpos);
          printf("\n");
          break;
      }
      case cod_type_specifier: {
          printf("0x%p  --  type_specifier ->\n", node);
          printf("	token : %d\n", node->node.type_specifier.token);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.type_specifier.lx_srcpos);
          printf("\n");
          printf("	created_type_decl : %p\n", node->node.type_specifier.created_type_decl);
          break;
      }
      case cod_struct_type_decl: {
          printf("0x%p  --  struct_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.struct_type_decl.lx_srcpos);
          printf("\n");
          printf("	id : %s\n", (node->node.struct_type_decl.id == NULL) ? "<NULL>" : node->node.struct_type_decl.id);
          printf("	fields : ");
          cod_print_sm_list(node->node.struct_type_decl.fields);
          printf("\n");
          printf("	cg_size : %d\n", node->node.struct_type_decl.cg_size);
          printf("	encode_info : ");
          cod_print_enc_info(node->node.struct_type_decl.encode_info);
          printf("\n");
          break;
      }
      case cod_enum_type_decl: {
          printf("0x%p  --  enum_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.enum_type_decl.lx_srcpos);
          printf("\n");
          printf("	id : %s\n", (node->node.enum_type_decl.id == NULL) ? "<NULL>" : node->node.enum_type_decl.id);
          printf("	enums : ");
          cod_print_sm_list(node->node.enum_type_decl.enums);
          printf("\n");
          break;
      }
      case cod_array_type_decl: {
          printf("0x%p  --  array_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.array_type_decl.lx_srcpos);
          printf("\n");
          printf("	size_expr : %p\n", node->node.array_type_decl.size_expr);
          printf("	element_ref : %p\n", node->node.array_type_decl.element_ref);
          printf("	static_var : %d\n", node->node.array_type_decl.static_var);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.array_type_decl.type_spec);
          printf("\n");
          printf("	dimensions : ");
          cod_print_dimen_p(node->node.array_type_decl.dimensions);
          printf("\n");
          printf("	cg_static_size : %d\n", node->node.array_type_decl.cg_static_size);
          printf("	sm_dynamic_size : %p\n", node->node.array_type_decl.sm_dynamic_size);
          printf("	cg_element_type : %d\n", node->node.array_type_decl.cg_element_type);
          printf("	sm_complex_element_type : %p\n", node->node.array_type_decl.sm_complex_element_type);
          printf("	freeable_complex_element_type : %p\n", node->node.array_type_decl.freeable_complex_element_type);
          printf("	cg_element_size : %d\n", node->node.array_type_decl.cg_element_size);
          break;
      }
      case cod_reference_type_decl: {
          printf("0x%p  --  reference_type_decl ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.reference_type_decl.lx_srcpos);
          printf("\n");
          printf("	name : %s\n", (node->node.reference_type_decl.name == NULL) ? "<NULL>" : node->node.reference_type_decl.name);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.reference_type_decl.type_spec);
          printf("\n");
          printf("	cg_referenced_type : %d\n", node->node.reference_type_decl.cg_referenced_type);
          printf("	sm_complex_referenced_type : %p\n", node->node.reference_type_decl.sm_complex_referenced_type);
          printf("	freeable_complex_referenced_type : %p\n", node->node.reference_type_decl.freeable_complex_referenced_type);
          printf("	cg_referenced_size : %d\n", node->node.reference_type_decl.cg_referenced_size);
          printf("	kernel_ref : %d\n", node->node.reference_type_decl.kernel_ref);
          break;
      }
      case cod_field: {
          printf("0x%p  --  field ->\n", node);
          printf("	name : %s\n", (node->node.field.name == NULL) ? "<NULL>" : node->node.field.name);
          printf("	string_type : %s\n", (node->node.field.string_type == NULL) ? "<NULL>" : node->node.field.string_type);
          printf("	type_spec : ");
          cod_print_sm_list(node->node.field.type_spec);
          printf("\n");
          printf("	sm_complex_type : %p\n", node->node.field.sm_complex_type);
          printf("	freeable_complex_type : %p\n", node->node.field.freeable_complex_type);
          printf("	cg_size : %d\n", node->node.field.cg_size);
          printf("	cg_offset : %d\n", node->node.field.cg_offset);
          printf("	cg_type : %d\n", node->node.field.cg_type);
          break;
      }
      case cod_field_ref: {
          printf("0x%p  --  field_ref ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.field_ref.lx_srcpos);
          printf("\n");
          printf("	struct_ref : %p\n", node->node.field_ref.struct_ref);
          printf("	lx_field : %s\n", (node->node.field_ref.lx_field == NULL) ? "<NULL>" : node->node.field_ref.lx_field);
          printf("	sm_field_ref : %p\n", node->node.field_ref.sm_field_ref);
          break;
      }
      case cod_subroutine_call: {
          printf("0x%p  --  subroutine_call ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.subroutine_call.lx_srcpos);
          printf("\n");
          printf("	sm_func_ref : %p\n", node->node.subroutine_call.sm_func_ref);
          printf("	arguments : ");
          cod_print_sm_list(node->node.subroutine_call.arguments);
          printf("\n");
          break;
      }
      case cod_element_ref: {
          printf("0x%p  --  element_ref ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.element_ref.lx_srcpos);
          printf("\n");
          printf("	array_ref : %p\n", node->node.element_ref.array_ref);
          printf("	sm_complex_element_type : %p\n", node->node.element_ref.sm_complex_element_type);
          printf("	sm_containing_structure_ref : %p\n", node->node.element_ref.sm_containing_structure_ref);
          printf("	cg_element_type : %d\n", node->node.element_ref.cg_element_type);
          printf("	this_index_dimension : %d\n", node->node.element_ref.this_index_dimension);
          printf("	expression : %p\n", node->node.element_ref.expression);
          break;
      }
      case cod_cast: {
          printf("0x%p  --  cast ->\n", node);
          printf("	lx_srcpos : ");
          cod_print_srcpos(node->node.cast.lx_srcpos);
          printf("\n");
          printf("	type_spec : ");
          cod_print_sm_list(node->node.cast.type_spec);
          printf("\n");
          printf("	cg_type : %d\n", node->node.cast.cg_type);
          printf("	expression : %p\n", node->node.cast.expression);
          printf("	sm_complex_type : %p\n", node->node.cast.sm_complex_type);
          break;
      }
      case cod_initializer_list: {
          printf("0x%p  --  initializer_list ->\n", node);
          printf("	initializers : ");
          cod_print_sm_list(node->node.initializer_list.initializers);
          printf("\n");
          break;
      }
      case cod_initializer: {
          printf("0x%p  --  initializer ->\n", node);
          printf("	designation : ");
          cod_print_sm_list(node->node.initializer.designation);
          printf("\n");
          printf("	initializer : %p\n", node->node.initializer.initializer);
          break;
      }
      case cod_designator: {
          printf("0x%p  --  designator ->\n", node);
          printf("	expression : %p\n", node->node.designator.expression);
          printf("	id : %s\n", (node->node.designator.id == NULL) ? "<NULL>" : node->node.designator.id);
          break;
      }
      default: printf("Unhandled case in cod_print\n");
    }
    printf("\n");
}